

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmathlib.c
# Opt level: O0

int luaopen_math(lua_State *L)

{
  lua_State *L_local;
  
  lua_createtable(L,0,0x1b);
  luaL_setfuncs(L,mathlib,0);
  lua_pushnumber(L,3.141592653589793);
  lua_setfield(L,-2,"pi");
  lua_pushnumber(L,INFINITY);
  lua_setfield(L,-2,"huge");
  return 1;
}

Assistant:

LUAMOD_API int luaopen_math (lua_State *L) {
  luaL_newlib(L, mathlib);
  lua_pushnumber(L, PI);
  lua_setfield(L, -2, "pi");
  lua_pushnumber(L, HUGE_VAL);
  lua_setfield(L, -2, "huge");
  return 1;
}